

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

void closure_f0_uniprocessor_check(void *v)

{
  closure_s_uniprocessor_check *a;
  void *v_local;
  
  (**(code **)((long)v + 8))(*(undefined8 *)((long)v + 0x10),*(undefined8 *)((long)v + 0x18));
  free(v);
  return;
}

Assistant:

static void uniprocessor_check (nsync_atomic_uint32_ *state, struct is_uniprocessor_s *s) {
	IGNORE_RACES_START ();
	while (ATM_LOAD_ACQ (state) != 1) {
	}
	while (ATM_LOAD_ACQ (state) == 1) {
		s->count++;
	}
	ATM_STORE_REL (&s->done, 1);
	IGNORE_RACES_END ();
}